

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.cpp
# Opt level: O0

void __thiscall StickyAssign_Copy_Test::TestBody(StickyAssign_Copy_Test *this)

{
  bool bVar1;
  int *rhs;
  char *message;
  AssertHelper local_60;
  Message local_58 [3];
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult gtest_ar;
  sticky_assign<int> local_20;
  sticky_assign<int> v2;
  sticky_assign<int> v1;
  StickyAssign_Copy_Test *this_local;
  
  pstore::serialize::sticky_assign<int>::sticky_assign(&v2);
  pstore::serialize::sticky_assign<int>::sticky_assign(&local_20,&v2);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x2a;
  pstore::serialize::sticky_assign<int>::operator=
            (&local_20,
             (int *)((long)&gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4));
  local_3c = 0;
  rhs = pstore::serialize::sticky_assign<int>::get(&local_20);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_38,"0","v2.get ()",&local_3c,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_58);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_common.cpp"
               ,0x35,message);
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message(local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST (StickyAssign, Copy) {
    pstore::serialize::sticky_assign<int> v1;      // default construct v1.
    pstore::serialize::sticky_assign<int> v2 (v1); // value construct v2.
    v2 = 42;                                       // assignment to v2 is ignored.
    EXPECT_EQ (0, v2.get ());
}